

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_complex.cpp
# Opt level: O1

void __thiscall
test_skeleton_iterator_simplices::test_method(test_skeleton_iterator_simplices *this)

{
  size_t sVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  mapped_type *pmVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  int iVar7;
  bool bVar8;
  map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
  expected_num_simplices;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  __begin2;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  __end2;
  Complex complex;
  int local_298;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  local_290;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  local_248;
  _Rb_tree_node_base *local_200;
  size_t local_1f8;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>,_std::_Select1st<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
  local_1f0;
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  local_1c0;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 local_148 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  _List_node_base local_118;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> local_100;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  local_60;
  
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex(&local_100,6,(Visitor *)0x0);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x0,(Vertex_handle)0x1);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x1,(Vertex_handle)0x2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x2,(Vertex_handle)0x0);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x1,(Vertex_handle)0x3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x2,(Vertex_handle)0x3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x2,(Vertex_handle)0x5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x3,(Vertex_handle)0x5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x2,(Vertex_handle)0x4);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x4,(Vertex_handle)0x5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&local_290,&local_100,(Vertex_handle)0x3,(Vertex_handle)0x4);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)&local_290,(Vertex_handle)0x2,(Vertex_handle)0x3,(Vertex_handle)0x4,
             (Vertex_handle)0x5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_blocker
            (&local_100,(Simplex *)&local_290);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
               *)&local_290);
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f0._M_impl.super__Rb_tree_header._M_header;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_290.complex._0_4_ = 0;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)&local_1f0,(key_type *)&local_290);
  *pmVar4 = 4;
  local_290.complex._0_4_ = 1;
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)&local_1f0,(key_type *)&local_290);
  *pmVar4 = 6;
  local_290.complex._0_4_ = 2;
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)&local_1f0,(key_type *)&local_290);
  *pmVar4 = 0xb;
  local_290.complex._0_4_ = 3;
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)&local_1f0,(key_type *)&local_290);
  *pmVar4 = 9;
  local_290.complex._0_4_ = 4;
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)&local_1f0,(key_type *)&local_290);
  *pmVar4 = 7;
  local_290.complex = (Complex *)CONCAT44(local_290.complex._4_4_,5);
  pmVar4 = std::
           map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
           ::operator[]((map<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
                         *)&local_1f0,(key_type *)&local_290);
  *pmVar4 = 7;
  if ((_Rb_tree_header *)local_1f0._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_1f0._M_impl.super__Rb_tree_header) {
LAB_0010935d:
    std::
    _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>,_std::_Select1st<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_unsigned_int>_>_>
    ::~_Rb_tree(&local_1f0);
    Gudhi::skeleton_blocker::
    Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
    ~Skeleton_blocker_complex(&local_100);
    return;
  }
  p_Var6 = local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00108f11:
  sVar1 = *(size_t *)(p_Var6 + 1);
  local_200 = p_Var6;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"found list: ",0xc);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  star_simplex_range((Complex_simplex_around_vertex_range *)&local_290,&local_100,
                     (Vertex_handle)(boost_vertex_handle)sVar1);
  Gudhi::skeleton_blocker::
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  ::Simplex_around_vertex_iterator(&local_1c0,&local_290);
  Gudhi::skeleton_blocker::
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  ::Simplex_around_vertex_iterator
            ((Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
              *)local_148,&local_248);
  iVar7 = 0;
  local_1f8 = sVar1;
  do {
    if ((Complex *)CONCAT71(local_1c0.complex._1_7_,local_1c0.complex._0_1_) ==
        (Complex *)local_148._0_8_) {
      if (local_1c0.v.vertex == local_148._8_4_) {
        bVar8 = local_1c0.nodes_to_be_seen.
                super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next ==
                (_List_node_base *)&local_1c0.nodes_to_be_seen;
        if (bVar8 || local_118._M_next == &local_118) {
          bVar8 = bVar8 && local_118._M_next == &local_118;
        }
        else {
          bVar8 = *(int *)&(local_1c0.nodes_to_be_seen.
                            super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
                            ._M_impl._M_node.super__List_node_base._M_next[1]._M_next)->_M_next ==
                  *(int *)&(local_118._M_next[1]._M_next)->_M_next;
        }
        if (bVar8) break;
      }
    }
    Gudhi::skeleton_blocker::
    Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
    ::dereference((Simplex *)&local_60,&local_1c0);
    poVar5 = Gudhi::skeleton_blocker::operator<<
                       ((ostream *)&std::clog,
                        (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                         *)&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
    iVar7 = iVar7 + 1;
    std::
    _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
    ::~_Rb_tree(&local_60);
    Gudhi::skeleton_blocker::
    Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
    ::increment(&local_1c0);
  } while( true );
  p_Var3 = local_118._M_next;
  while (p_Var3 != &local_118) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  p_Var3 = local_1c0.nodes_to_be_seen.
           super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&local_1c0.nodes_to_be_seen) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  if (local_1c0.trie.
      super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.trie.
               super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1c0.link_v.
      super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.link_v.
               super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  p_Var3 = local_248.nodes_to_be_seen.
           super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&local_248.nodes_to_be_seen) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  if (local_248.trie.
      super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.trie.
               super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  p_Var3 = local_290.nodes_to_be_seen.
           super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (local_248.link_v.
      super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.link_v.
               super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    p_Var3 = local_290.nodes_to_be_seen.
             super__List_base<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*,_std::allocator<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var3 != (_List_node_base *)&local_290.nodes_to_be_seen) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  if (local_290.trie.
      super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.trie.
               super___shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_290.link_v.
      super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.link_v.
               super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0xe1,&local_168);
  local_298 = (int)(sVar1 >> 0x20);
  local_1c0.complex._0_1_ = local_298 == iVar7;
  local_1c0.v.vertex = 0;
  local_1c0._12_4_ = 0;
  local_1c0.link_v.
  super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_148._0_8_ = "num_simplices_around == pair.second";
  local_148._8_8_ = "";
  local_290.v.vertex._0_1_ = 0;
  local_290.complex = (Complex *)&PTR__lazy_ostream_00136b50;
  local_290.link_v.
  super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&boost::unit_test::lazy_ostream::inst;
  local_290.link_v.
  super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
  ;
  local_170 = "";
  boost::test_tools::tt_detail::report_assertion(&local_1c0,&local_290,&local_178,0xe1,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1c0.link_v);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + ' ');
  std::ostream::put(' ');
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"current vertex:",0xf);
  std::ostream::operator<<((ostream *)poVar5,(int)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"expected_num_simplices:",0x17);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"found:",6);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_200);
  if ((_Rb_tree_header *)p_Var6 == &local_1f0._M_impl.super__Rb_tree_header) goto LAB_0010935d;
  goto LAB_00108f11;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_iterator_simplices) {
  Complex complex(6);
  complex.add_edge_without_blockers(Vertex_handle(0), Vertex_handle(1));
  complex.add_edge_without_blockers(Vertex_handle(1), Vertex_handle(2));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(0));
  complex.add_edge_without_blockers(Vertex_handle(1), Vertex_handle(3));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(3));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(5));
  complex.add_edge_without_blockers(Vertex_handle(3), Vertex_handle(5));
  complex.add_edge_without_blockers(Vertex_handle(2), Vertex_handle(4));
  complex.add_edge_without_blockers(Vertex_handle(4), Vertex_handle(5));
  complex.add_edge_without_blockers(Vertex_handle(3), Vertex_handle(4));

  complex.add_blocker(Simplex(Vertex_handle(2), Vertex_handle(3), Vertex_handle(4), Vertex_handle(5)));

  std::map<Vertex_handle, unsigned> expected_num_simplices;

  expected_num_simplices[Vertex_handle(0)] = 4;
  expected_num_simplices[Vertex_handle(1)] = 6;
  expected_num_simplices[Vertex_handle(2)] = 11;
  expected_num_simplices[Vertex_handle(3)] = 9;
  expected_num_simplices[Vertex_handle(4)] = 7;
  expected_num_simplices[Vertex_handle(5)] = 7;

  for (auto pair : expected_num_simplices) {
    std::clog << "found list: ";
    unsigned num_simplices_around = 0;
    for (const auto& simplex : complex.star_simplex_range(pair.first)) {
      simplex.dimension();
      std::clog << simplex << " - ";
      ++num_simplices_around;
    }

    BOOST_CHECK(num_simplices_around == pair.second);

    std::clog << std::endl << "current vertex:" << pair.first << " - ";
    std::clog << "expected_num_simplices:" << pair.second << " - ";
    std::clog << "found:" << num_simplices_around << std::endl;
  }
}